

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.cpp
# Opt level: O2

void __thiscall Js::AsmJsFunc::ReleaseLocationGeneric(AsmJsFunc *this,EmitExpressionInfo *pnode)

{
  Which WVar1;
  
  if ((pnode != (EmitExpressionInfo *)0x0) && (WVar1 = (pnode->type).which_, WVar1 < Void)) {
    if ((0x1e01U >> (WVar1 & (Float64x2|Floatish)) & 1) != 0) {
      ReleaseLocation<int>(this,pnode);
      return;
    }
    if ((0x34U >> (WVar1 & (Float64x2|Floatish)) & 1) != 0) {
      ReleaseLocation<double>(this,pnode);
      return;
    }
    if ((200U >> (WVar1 & (Float64x2|Floatish)) & 1) != 0) {
      ReleaseLocation<float>(this,pnode);
      return;
    }
  }
  return;
}

Assistant:

void AsmJsFunc::ReleaseLocationGeneric(const EmitExpressionInfo* pnode)
    {
        if (pnode)
        {
            if (pnode->type.isIntish())
            {
                ReleaseLocation<int>(pnode);
            }
            else if (pnode->type.isMaybeDouble())
            {
                ReleaseLocation<double>(pnode);
            }
            else if (pnode->type.isFloatish())
            {
                ReleaseLocation<float>(pnode);
            }
        }
    }